

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O1

void blake2b_compress(blake2b_state *S,uint8_t *block)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint64_t uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint64_t m [16];
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  uint64_t local_138;
  uint64_t uStack_130;
  ulong local_128;
  uint64_t uStack_120;
  uint64_t local_118;
  uint64_t uStack_110;
  undefined8 local_108;
  undefined8 local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong uStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  blake2b_state *local_c8;
  ulong local_c0;
  long local_b8 [17];
  
  memcpy(local_b8,block,0x80);
  local_148 = S->h[0];
  uStack_140 = S->h[1];
  local_138 = S->h[2];
  uStack_130 = S->h[3];
  local_128 = S->h[4];
  uStack_120 = S->h[5];
  local_118 = S->h[6];
  uStack_110 = S->h[7];
  local_168 = 0x6a09e667f3bcc908;
  local_108 = 0x6a09e667f3bcc908;
  local_160 = 0xbb67ae8584caa73b;
  local_100 = 0xbb67ae8584caa73b;
  local_158 = 0x3c6ef372fe94f82b;
  local_f8 = 0x3c6ef372fe94f82b;
  local_150 = 0xa54ff53a5f1d36f1;
  local_f0 = 0xa54ff53a5f1d36f1;
  local_e8 = S->t[0] ^ 0x510e527fade682d1;
  uStack_e0 = S->t[1] ^ 0x9b05688c2b3e6c1f;
  local_c8 = S;
  local_d8 = S->f[0] ^ 0x1f83d9abfb41bd6b;
  uStack_d0 = S->f[1] ^ 0x5be0cd19137e2179;
  lVar13 = 0x3c;
  do {
    local_c0 = (ulong)*(uint *)((long)blake2b_IV + lVar13 + 4);
    uVar20 = local_148 + local_128 + local_b8[local_c0];
    uVar15 = uStack_140 + uStack_120 + local_b8[*(uint *)((long)blake2b_IV + lVar13 + 0xc)];
    uVar22 = local_138 + local_118 + local_b8[*(uint *)((long)blake2b_IV + lVar13 + 0x14)];
    local_e8 = local_e8 ^ uVar20;
    uVar12 = local_e8 << 0x20 | local_e8 >> 0x20;
    local_168 = local_168 + uVar12;
    uStack_e0 = uStack_e0 ^ uVar15;
    uVar24 = uStack_e0 << 0x20 | uStack_e0 >> 0x20;
    local_128 = local_128 ^ local_168;
    local_160 = local_160 + uVar24;
    uVar17 = uStack_120 ^ local_160;
    uVar14 = local_128 << 0x28 | local_128 >> 0x18;
    uVar18 = uVar17 << 0x28 | uVar17 >> 0x18;
    local_d8 = local_d8 ^ uVar22;
    uVar17 = local_d8 << 0x20 | local_d8 >> 0x20;
    uVar21 = uVar20 + uVar14 + local_b8[*(uint *)((long)blake2b_IV + lVar13 + 8)];
    local_158 = local_158 + uVar17;
    uVar20 = local_118 ^ local_158;
    uVar19 = uVar20 << 0x28 | uVar20 >> 0x18;
    uVar16 = uVar15 + uVar18 + local_b8[*(uint *)((long)blake2b_IV + lVar13 + 0x10)];
    uVar12 = uVar12 ^ uVar21;
    uVar23 = uVar22 + uVar19 + local_b8[*(uint *)((long)blake2b_IV + lVar13 + 0x18)];
    uVar12 = uVar12 << 0x30 | uVar12 >> 0x10;
    uVar24 = uVar24 ^ uVar16;
    uVar17 = uVar17 ^ uVar23;
    uVar24 = uVar24 << 0x30 | uVar24 >> 0x10;
    uVar17 = uVar17 << 0x30 | uVar17 >> 0x10;
    uVar15 = uStack_130 + uStack_110 + local_b8[*(uint *)((long)blake2b_IV + lVar13 + 0x1c)];
    uStack_d0 = uStack_d0 ^ uVar15;
    local_168 = local_168 + uVar12;
    uVar22 = uStack_d0 << 0x20 | uStack_d0 >> 0x20;
    local_150 = local_150 + uVar22;
    local_160 = local_160 + uVar24;
    uVar20 = uStack_110 ^ local_150;
    uVar20 = uVar20 << 0x28 | uVar20 >> 0x18;
    uVar14 = uVar14 ^ local_168;
    local_158 = local_158 + uVar17;
    uVar18 = uVar18 ^ local_160;
    uVar15 = uVar15 + uVar20 + local_b8[*(uint *)((long)blake2b_IV + lVar13 + 0x20)];
    uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
    uVar19 = uVar19 ^ local_158;
    uVar22 = uVar22 ^ uVar15;
    uVar18 = uVar18 << 1 | (ulong)((long)uVar18 < 0);
    uVar22 = uVar22 << 0x30 | uVar22 >> 0x10;
    uVar19 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
    local_150 = local_150 + uVar22;
    uVar20 = uVar20 ^ local_150;
    uVar20 = uVar20 << 1 | (ulong)((long)uVar20 < 0);
    uVar21 = uVar21 + uVar18 + local_b8[*(uint *)((long)blake2b_IV + lVar13 + 0x24)];
    uVar22 = uVar22 ^ uVar21;
    uVar22 = uVar22 << 0x20 | uVar22 >> 0x20;
    uVar16 = uVar16 + uVar19 + local_b8[*(uint *)((long)blake2b_IV + lVar13 + 0x2c)];
    local_158 = local_158 + uVar22;
    uVar18 = uVar18 ^ local_158;
    uVar18 = uVar18 << 0x28 | uVar18 >> 0x18;
    uVar23 = uVar23 + uVar20 + local_b8[*(uint *)((long)blake2b_IV + lVar13 + 0x34)];
    uVar12 = uVar12 ^ uVar16;
    local_148 = uVar21 + uVar18 + local_b8[*(uint *)((long)blake2b_IV + lVar13 + 0x28)];
    uVar12 = uVar12 << 0x20 | uVar12 >> 0x20;
    uVar15 = uVar15 + uVar14 + local_b8[*(uint *)((long)blake2b_IV + lVar13 + 0x3c)];
    local_150 = local_150 + uVar12;
    uVar24 = uVar24 ^ uVar23;
    uVar21 = uVar24 << 0x20 | uVar24 >> 0x20;
    uVar19 = uVar19 ^ local_150;
    local_168 = local_168 + uVar21;
    uVar20 = uVar20 ^ local_168;
    uVar19 = uVar19 << 0x28 | uVar19 >> 0x18;
    uVar20 = uVar20 << 0x28 | uVar20 >> 0x18;
    uVar17 = uVar17 ^ uVar15;
    uVar17 = uVar17 << 0x20 | uVar17 >> 0x20;
    uStack_140 = uVar16 + uVar19 + local_b8[*(uint *)((long)blake2b_IV + lVar13 + 0x30)];
    local_160 = local_160 + uVar17;
    uVar14 = uVar14 ^ local_160;
    uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
    local_138 = uVar23 + uVar20 + local_b8[*(uint *)((long)blake2b_IV + lVar13 + 0x38)];
    uStack_130 = uVar15 + uVar14 + local_b8[*(uint *)((long)blake2b_sigma[0] + lVar13)];
    uVar22 = uVar22 ^ local_148;
    uStack_d0 = uVar22 << 0x30 | uVar22 >> 0x10;
    uVar12 = uVar12 ^ uStack_140;
    local_e8 = uVar12 << 0x30 | uVar12 >> 0x10;
    local_158 = local_158 + uStack_d0;
    local_150 = local_150 + local_e8;
    uVar21 = uVar21 ^ local_138;
    uVar18 = uVar18 ^ local_158;
    uStack_e0 = uVar21 << 0x30 | uVar21 >> 0x10;
    local_168 = local_168 + uStack_e0;
    uVar19 = uVar19 ^ local_150;
    uVar20 = uVar20 ^ local_168;
    uVar17 = uVar17 ^ uStack_130;
    uStack_120 = uVar18 << 1 | (ulong)((long)uVar18 < 0);
    local_d8 = uVar17 << 0x30 | uVar17 >> 0x10;
    local_118 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
    local_160 = local_160 + local_d8;
    uVar14 = uVar14 ^ local_160;
    uStack_110 = uVar20 << 1 | (ulong)((long)uVar20 < 0);
    local_128 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
    lVar13 = lVar13 + 0x40;
  } while (lVar13 != 0x33c);
  local_108 = local_168;
  local_100 = local_160;
  local_f8 = local_158;
  local_f0 = local_150;
  lVar13 = 0;
  do {
    puVar1 = S->h + lVar13;
    uVar3 = *(uint *)((long)puVar1 + 4);
    uVar11 = puVar1[1];
    uVar4 = *(uint *)((long)puVar1 + 0xc);
    uVar5 = *(uint *)((long)&local_148 + lVar13 * 8 + 4);
    uVar6 = *(uint *)(&uStack_140 + lVar13);
    uVar7 = *(uint *)((long)&uStack_140 + lVar13 * 8 + 4);
    uVar8 = *(uint *)((long)&local_108 + lVar13 * 8 + 4);
    uVar9 = *(uint *)(&local_100 + lVar13);
    uVar10 = *(uint *)((long)&local_100 + lVar13 * 8 + 4);
    puVar2 = S->h + lVar13;
    *(uint *)puVar2 =
         (uint)*puVar1 ^ *(uint *)(&local_148 + lVar13) ^ *(uint *)(&local_108 + lVar13);
    *(uint *)((long)puVar2 + 4) = uVar3 ^ uVar5 ^ uVar8;
    *(uint *)(puVar2 + 1) = (uint)uVar11 ^ uVar6 ^ uVar9;
    *(uint *)((long)puVar2 + 0xc) = uVar4 ^ uVar7 ^ uVar10;
    lVar13 = lVar13 + 2;
  } while (lVar13 != 8);
  return;
}

Assistant:

static void blake2b_compress(blake2b_state *S, const uint8_t *block) {
	uint64_t m[16];
	uint64_t v[16];
	unsigned int i, r;

	for (i = 0; i < 16; ++i) {
		m[i] = load64(block + i * sizeof(m[i]));
	}

	for (i = 0; i < 8; ++i) {
		v[i] = S->h[i];
	}

	v[8] = blake2b_IV[0];
	v[9] = blake2b_IV[1];
	v[10] = blake2b_IV[2];
	v[11] = blake2b_IV[3];
	v[12] = blake2b_IV[4] ^ S->t[0];
	v[13] = blake2b_IV[5] ^ S->t[1];
	v[14] = blake2b_IV[6] ^ S->f[0];
	v[15] = blake2b_IV[7] ^ S->f[1];

#define G(r, i, a, b, c, d)                                                    \
    do {                                                                       \
        a = a + b + m[blake2b_sigma[r][2 * i + 0]];                            \
        d = rotr64(d ^ a, 32);                                                 \
        c = c + d;                                                             \
        b = rotr64(b ^ c, 24);                                                 \
        a = a + b + m[blake2b_sigma[r][2 * i + 1]];                            \
        d = rotr64(d ^ a, 16);                                                 \
        c = c + d;                                                             \
        b = rotr64(b ^ c, 63);                                                 \
    } while ((void)0, 0)

#define ROUND(r)                                                               \
    do {                                                                       \
        G(r, 0, v[0], v[4], v[8], v[12]);                                      \
        G(r, 1, v[1], v[5], v[9], v[13]);                                      \
        G(r, 2, v[2], v[6], v[10], v[14]);                                     \
        G(r, 3, v[3], v[7], v[11], v[15]);                                     \
        G(r, 4, v[0], v[5], v[10], v[15]);                                     \
        G(r, 5, v[1], v[6], v[11], v[12]);                                     \
        G(r, 6, v[2], v[7], v[8], v[13]);                                      \
        G(r, 7, v[3], v[4], v[9], v[14]);                                      \
    } while ((void)0, 0)

	for (r = 0; r < 12; ++r) {
		ROUND(r);
	}

	for (i = 0; i < 8; ++i) {
		S->h[i] = S->h[i] ^ v[i] ^ v[i + 8];
	}

#undef G
#undef ROUND
}